

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O1

void __thiscall Assimp::FBXExporter::ExportAscii(FBXExporter *this,char *pFile,IOSystem *pIOSystem)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  undefined4 extraout_var;
  runtime_error *this_01;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->binary = false;
  iVar2 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::IOStream>
            (&(this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>,
             (IOStream *)CONCAT44(extraout_var,iVar2));
  if ((this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pFile,&local_61);
    std::operator+(&local_40,"could not open output .fbx file: ",&local_60);
    std::runtime_error::runtime_error(this_01,(string *)&local_40);
    *(undefined ***)this_01 = &PTR__runtime_error_0082bce0;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  WriteAsciiHeader(this);
  WriteAllNodes(this);
  peVar1 = (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_IOStream[3])(peVar1,"\n",1,1);
  this_00 = (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void FBXExporter::ExportAscii (
    const char* pFile,
    IOSystem* pIOSystem
){
    // remember that we're exporting in ascii mode
    binary = false;

    // open the indicated file for writing in text mode
    outfile.reset(pIOSystem->Open(pFile,"wt"));
    if (!outfile) {
        throw DeadlyExportError(
            "could not open output .fbx file: " + std::string(pFile)
        );
    }

    // write the ascii header
    WriteAsciiHeader();

    // write all the sections
    WriteAllNodes();

    // make sure the file ends with a newline.
    // note: if the file is opened in text mode,
    // this should do the right cross-platform thing.
    outfile->Write("\n", 1, 1);

    // explicitly release file pointer,
    // so we don't have to rely on class destruction.
    outfile.reset();
}